

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

void calc_mb_wiener_var(AV1_COMP *cpi,double *sum_rec_distortion,double *sum_est_rate)

{
  byte bVar1;
  long in_RDI;
  int mi_row;
  tran_low_t dqcoeff [1024];
  tran_low_t qcoeff [1024];
  tran_low_t coeff [1024];
  int16_t src_diff [1024];
  int mb_step;
  BLOCK_SIZE bsize;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  int local_3864;
  tran_low_t *in_stack_ffffffffffffca20;
  int16_t *in_stack_ffffffffffffca28;
  int in_stack_ffffffffffffca34;
  MACROBLOCKD *in_stack_ffffffffffffca38;
  MACROBLOCK *in_stack_ffffffffffffca40;
  AV1_COMP *in_stack_ffffffffffffca48;
  tran_low_t *in_stack_ffffffffffffca68;
  tran_low_t *in_stack_ffffffffffffca70;
  double *in_stack_ffffffffffffca78;
  double *in_stack_ffffffffffffca80;
  uint8_t *in_stack_ffffffffffffca88;
  
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [*(byte *)(in_RDI + 0x9d5f8)];
  for (local_3864 = 0; local_3864 < *(int *)(in_RDI + 0x712d0);
      local_3864 = (uint)bVar1 + local_3864) {
    av1_calc_mb_wiener_var_row
              (in_stack_ffffffffffffca48,in_stack_ffffffffffffca40,in_stack_ffffffffffffca38,
               in_stack_ffffffffffffca34,in_stack_ffffffffffffca28,in_stack_ffffffffffffca20,
               in_stack_ffffffffffffca68,in_stack_ffffffffffffca70,in_stack_ffffffffffffca78,
               in_stack_ffffffffffffca80,in_stack_ffffffffffffca88);
  }
  return;
}

Assistant:

static void calc_mb_wiener_var(AV1_COMP *const cpi, double *sum_rec_distortion,
                               double *sum_est_rate) {
  MACROBLOCK *x = &cpi->td.mb;
  MACROBLOCKD *xd = &x->e_mbd;
  const BLOCK_SIZE bsize = cpi->weber_bsize;
  const int mb_step = mi_size_wide[bsize];
  DECLARE_ALIGNED(32, int16_t, src_diff[32 * 32]);
  DECLARE_ALIGNED(32, tran_low_t, coeff[32 * 32]);
  DECLARE_ALIGNED(32, tran_low_t, qcoeff[32 * 32]);
  DECLARE_ALIGNED(32, tran_low_t, dqcoeff[32 * 32]);
  for (int mi_row = 0; mi_row < cpi->frame_info.mi_rows; mi_row += mb_step) {
    av1_calc_mb_wiener_var_row(cpi, x, xd, mi_row, src_diff, coeff, qcoeff,
                               dqcoeff, sum_rec_distortion, sum_est_rate,
                               cpi->td.wiener_tmp_pred_buf);
  }
}